

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<Fad<double>_>::AddKel
          (TPZMatrix<Fad<double>_> *this,TPZFMatrix<Fad<double>_> *elmat,TPZVec<long> *source,
          TPZVec<long> *destinationindex)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  Fad<double> prevval;
  Fad<double> local_90;
  TPZVec<long> *local_70;
  TPZVec<long> *local_68;
  long local_60;
  long local_58;
  Fad<double> local_50;
  
  lVar2 = source->fNElements;
  local_70 = source;
  local_68 = destinationindex;
  Fad<double>::Fad(&local_90);
  iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x10])(this);
  if (iVar6 == 0) {
    if (0 < lVar2) {
      lVar10 = 0;
      do {
        lVar3 = local_68->fStore[lVar10];
        lVar4 = local_70->fStore[lVar10];
        local_58 = lVar4 << 5;
        lVar11 = 0;
        local_60 = lVar10;
        do {
          lVar10 = local_68->fStore[lVar11];
          lVar8 = local_70->fStore[lVar11];
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_50,this,lVar3,lVar10);
          local_90.val_ = local_50.val_;
          Vector<double>::operator=(&local_90.dx_,&local_50.dx_);
          local_90.defaultVal = local_50.defaultVal;
          Fad<double>::~Fad(&local_50);
          if ((((lVar4 < 0) ||
               ((elmat->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar4)) ||
              (lVar8 < 0)) ||
             ((elmat->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol <= lVar8)) {
            TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar8 = lVar8 * (elmat->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
          uVar1 = *(uint *)((long)&elmat->fElem[lVar8].dx_.num_elts + local_58);
          lVar12 = (long)(int)uVar1;
          pdVar9 = (double *)((long)&elmat->fElem[lVar8].val_ + local_58);
          if (lVar12 != 0) {
            dVar5 = pdVar9[2];
            if ((ulong)(uint)local_90.dx_.num_elts == 0) {
              uVar7 = lVar12 * 8;
              if ((int)uVar1 < 0) {
                uVar7 = 0xffffffffffffffff;
              }
              local_90.dx_.num_elts = uVar1;
              local_90.dx_.ptr_to_data = (double *)operator_new__(uVar7);
              if (0 < (int)uVar1) {
                lVar8 = 0;
                do {
                  local_90.dx_.ptr_to_data[lVar8] = *(double *)((long)dVar5 + lVar8 * 8);
                  lVar8 = lVar8 + 1;
                } while (lVar12 != lVar8);
              }
            }
            else if (0 < local_90.dx_.num_elts) {
              uVar7 = 0;
              do {
                local_90.dx_.ptr_to_data[uVar7] =
                     *(double *)((long)dVar5 + uVar7 * 8) + local_90.dx_.ptr_to_data[uVar7];
                uVar7 = uVar7 + 1;
              } while ((uint)local_90.dx_.num_elts != uVar7);
            }
          }
          local_90.val_ = *pdVar9 + local_90.val_;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar3,lVar10,&local_90);
          lVar11 = lVar11 + 1;
        } while (lVar11 != lVar2);
        lVar10 = local_60 + 1;
      } while (lVar10 != lVar2);
    }
  }
  else if (0 < lVar2) {
    lVar10 = 0;
    do {
      lVar3 = local_68->fStore[lVar10];
      lVar4 = local_70->fStore[lVar10];
      local_58 = lVar4 << 5;
      local_60 = lVar10;
      do {
        lVar11 = local_68->fStore[lVar10];
        lVar8 = local_70->fStore[lVar10];
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_50,this,lVar3,lVar11);
        local_90.val_ = local_50.val_;
        Vector<double>::operator=(&local_90.dx_,&local_50.dx_);
        local_90.defaultVal = local_50.defaultVal;
        Fad<double>::~Fad(&local_50);
        if (((lVar4 < 0) ||
            ((elmat->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar4)) ||
           ((lVar8 < 0 || ((elmat->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol <= lVar8)
            ))) {
          TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar8 = lVar8 * (elmat->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
        uVar1 = *(uint *)((long)&elmat->fElem[lVar8].dx_.num_elts + local_58);
        lVar12 = (long)(int)uVar1;
        pdVar9 = (double *)((long)&elmat->fElem[lVar8].val_ + local_58);
        if (lVar12 != 0) {
          dVar5 = pdVar9[2];
          if ((ulong)(uint)local_90.dx_.num_elts == 0) {
            uVar7 = lVar12 * 8;
            if ((int)uVar1 < 0) {
              uVar7 = 0xffffffffffffffff;
            }
            local_90.dx_.num_elts = uVar1;
            local_90.dx_.ptr_to_data = (double *)operator_new__(uVar7);
            if (0 < (int)uVar1) {
              lVar8 = 0;
              do {
                local_90.dx_.ptr_to_data[lVar8] = *(double *)((long)dVar5 + lVar8 * 8);
                lVar8 = lVar8 + 1;
              } while (lVar12 != lVar8);
            }
          }
          else if (0 < local_90.dx_.num_elts) {
            uVar7 = 0;
            do {
              local_90.dx_.ptr_to_data[uVar7] =
                   *(double *)((long)dVar5 + uVar7 * 8) + local_90.dx_.ptr_to_data[uVar7];
              uVar7 = uVar7 + 1;
            } while ((uint)local_90.dx_.num_elts != uVar7);
          }
        }
        local_90.val_ = *pdVar9 + local_90.val_;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar3,lVar11,&local_90);
        lVar10 = lVar10 + 1;
      } while (lVar10 < lVar2);
      lVar10 = local_60 + 1;
    } while (lVar10 != lVar2);
  }
  Fad<double>::~Fad(&local_90);
  return;
}

Assistant:

void TPZMatrix<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &source, TPZVec<int64_t> &destinationindex) {
	
	int64_t nelem = source.NElements();
  	int64_t icoef,jcoef,ieq,jeq,ieqs,jeqs;
    TVar prevval;
	if(IsSymmetric()) {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			ieqs = source[icoef];
			for(jcoef=icoef; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				jeqs = source[jcoef];
				prevval = GetVal(ieq,jeq);
				prevval += elmat(ieqs,jeqs);
				PutVal(ieq,jeq,prevval);
			}
		}
	} else {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			ieqs = source[icoef];
			for(jcoef=0; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				jeqs = source[jcoef];
				prevval = GetVal(ieq,jeq);
				prevval += elmat(ieqs,jeqs);
				PutVal(ieq,jeq,prevval);
			}
		}
	}
}